

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++
          (iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *this)

{
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar1;
  size_t sVar2;
  ulong uVar3;
  iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> iVar4;
  
  pDVar1 = this->d;
  sVar2 = pDVar1->numBuckets;
  uVar3 = this->bucket;
  do {
    iVar4.bucket = uVar3 + 1;
    this->bucket = iVar4.bucket;
    if (sVar2 - 1 == uVar3) {
      this->d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
      this->bucket = 0;
      return (iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>)ZEXT816(0);
    }
    uVar3 = iVar4.bucket;
  } while (pDVar1->spans[iVar4.bucket >> 7].offsets[(uint)iVar4.bucket & 0x7f] == 0xff);
  iVar4.d = pDVar1;
  return iVar4;
}

Assistant:

iterator operator++() noexcept
    {
        while (true) {
            ++bucket;
            if (bucket == d->numBuckets) {
                d = nullptr;
                bucket = 0;
                break;
            }
            if (!isUnused())
                break;
        }
        return *this;
    }